

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyInteger4Mask
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,bool enableRef0,
          GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,GLint reference3,
          bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  float fVar5;
  StateQueryMemoryWriteGuard<float[4]> floatVector4;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            (&floatVector4);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&floatVector4,testCtx);
  if (!bVar1) {
    return;
  }
  fVar5 = (float)reference0;
  if (enableRef0) {
    if ((floatVector4.m_value[0] != fVar5) || (NAN(floatVector4.m_value[0]) || NAN(fVar5)))
    goto LAB_00ee65d1;
  }
  if (enableRef1) {
    if ((floatVector4.m_value[1] != (float)reference1) ||
       (NAN(floatVector4.m_value[1]) || NAN((float)reference1))) goto LAB_00ee65d1;
  }
  if (enableRef2) {
    if ((floatVector4.m_value[2] != (float)reference2) ||
       (NAN(floatVector4.m_value[2]) || NAN((float)reference2))) goto LAB_00ee65d1;
  }
  if (!enableRef3) {
    return;
  }
  if ((floatVector4.m_value[3] == (float)reference3) &&
     (!NAN(floatVector4.m_value[3]) && !NAN((float)reference3))) {
    return;
  }
LAB_00ee65d1:
  local_1b0._0_8_ = testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// ERROR: expected ");
  pbVar4 = (bool *)0x17a2f58;
  pbVar2 = (bool *)0x17a2f58;
  if (enableRef0) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::ostream::operator<<(this_00,fVar5);
  pbVar3 = (bool *)0x172cb17;
  pbVar2 = (bool *)0x172cb17;
  if (enableRef0) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::operator<<((ostream *)this_00,", ");
  pbVar2 = (bool *)0x17a2f58;
  if (enableRef1) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::ostream::operator<<(this_00,(float)reference1);
  pbVar2 = (bool *)0x172cb17;
  if (enableRef1) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::operator<<((ostream *)this_00,", ");
  pbVar2 = (bool *)0x17a2f58;
  if (enableRef2) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::ostream::operator<<(this_00,(float)reference2);
  pbVar2 = (bool *)0x172cb17;
  if (enableRef2) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar2);
  std::operator<<((ostream *)this_00,", ");
  if (enableRef3) {
    pbVar4 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar4);
  std::ostream::operator<<(this_00,(float)reference3);
  if (enableRef3) {
    pbVar3 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pbVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (floatVector4[0] != GLfloat(reference0))) ||
		(enableRef1 && (floatVector4[1] != GLfloat(reference1))) ||
		(enableRef2 && (floatVector4[2] != GLfloat(reference2))) ||
		(enableRef3 && (floatVector4[3] != GLfloat(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << GLfloat(reference0) << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << GLfloat(reference1) << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << GLfloat(reference2) << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << GLfloat(reference3) << (enableRef3?"":")") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}